

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzP.cpp
# Opt level: O2

void __thiscall chrono::fea::ChNodeFEAxyzP::ArchiveOUT(ChNodeFEAxyzP *this)

{
  ChArchiveOut *in_RSI;
  
  ArchiveOUT((ChNodeFEAxyzP *)
             ((long)&(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase +
             (long)(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-0x17]),in_RSI);
  return;
}

Assistant:

void ChNodeFEAxyzP::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChNodeFEAxyzP>();
    // serialize parent class
    ChNodeFEAbase::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(P);
    marchive << CHNVP(P_dt);
    marchive << CHNVP(F);
}